

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O2

void __thiscall vkb::Result<vkb::SystemInfo>::destroy(Result<vkb::SystemInfo> *this)

{
  if (this->m_init != true) {
    return;
  }
  std::_Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~_Vector_base
            (&(this->field_0).m_value.available_extensions.
              super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>);
  std::_Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_>::~_Vector_base
            ((_Vector_base<VkLayerProperties,_std::allocator<VkLayerProperties>_> *)this);
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }